

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O2

int google::protobuf::internal::
    MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::CustomModel_CustomModelParamValue>
    ::GetCachedSize(MapEntryAccessorType *value)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = value->_cached_size_ | 1;
  iVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  return (iVar1 * 9 + 0x49U >> 6) + value->_cached_size_;
}

Assistant:

int GetCachedSize() const PROTOBUF_FINAL { return _cached_size_; }